

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O0

int luaB_auxwrap(lua_State *L)

{
  int iVar1;
  lua_State *co_00;
  int local_28;
  int stat;
  int r;
  lua_State *co;
  lua_State *L_local;
  
  co_00 = lua_tothread(L,-0xf4629);
  iVar1 = lua_gettop(L);
  L_local._4_4_ = auxresume(L,co_00,iVar1);
  if (L_local._4_4_ < 0) {
    local_28 = lua_status(co_00);
    if ((local_28 != 0) && (local_28 != 1)) {
      local_28 = lua_closethread(co_00,L);
      lua_xmove(co_00,L,1);
    }
    if ((local_28 != 4) && (iVar1 = lua_type(L,-1), iVar1 == 4)) {
      luaL_where(L,1);
      lua_rotate(L,-2,1);
      lua_concat(L,2);
    }
    L_local._4_4_ = lua_error(L);
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_auxwrap (lua_State *L) {
  lua_State *co = lua_tothread(L, lua_upvalueindex(1));
  int r = auxresume(L, co, lua_gettop(L));
  if (l_unlikely(r < 0)) {  /* error? */
    int stat = lua_status(co);
    if (stat != LUA_OK && stat != LUA_YIELD) {  /* error in the coroutine? */
      stat = lua_closethread(co, L);  /* close its tbc variables */
      lua_assert(stat != LUA_OK);
      lua_xmove(co, L, 1);  /* move error message to the caller */
    }
    if (stat != LUA_ERRMEM &&  /* not a memory error and ... */
        lua_type(L, -1) == LUA_TSTRING) {  /* ... error object is a string? */
      luaL_where(L, 1);  /* add extra info, if available */
      lua_insert(L, -2);
      lua_concat(L, 2);
    }
    return lua_error(L);  /* propagate error */
  }
  return r;
}